

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

word Nf_MatchDeref_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM)

{
  uint i_00;
  int iVar1;
  int *pCutSet;
  uint *puVar2;
  word wVar3;
  uint c_00;
  word *pwVar4;
  byte bVar5;
  uint uVar6;
  bool bVar7;
  word local_38;
  
  if (-1 < (int)*(uint *)pM) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x6a1,"word Nf_MatchDeref_rec(Nf_Man_t *, int, int, Nf_Mat_t *)");
  }
  if ((*(uint *)pM >> 0x1e & 1) == 0) {
    iVar1 = Vec_IntEntry(&p->vCutSets,i);
    bVar5 = 0;
    if (iVar1 == 0) {
      return 0;
    }
    pCutSet = Nf_ObjCutSet(p,i);
    puVar2 = (uint *)Nf_CutFromHandle(pCutSet,*(uint *)pM >> 0x14 & 0x3ff);
    local_38 = 0;
    for (uVar6 = 0; uVar6 < (*puVar2 & 0x1f); uVar6 = uVar6 + 1) {
      i_00 = puVar2[(ulong)(((uint)pM->Cfg >> 8) >> (bVar5 & 0x1f) & 0xf) + 1];
      if ((long)(int)i_00 == 0) break;
      bVar7 = (((uint)pM->Cfg >> 1 & 0x7f) >> (uVar6 & 0x1f) & 1) != 0;
      c_00 = (uint)bVar7;
      iVar1 = Nf_ObjMapRefNum(p,i_00,c_00);
      if (iVar1 < 1) {
        __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x6ae,"word Nf_MatchDeref_rec(Nf_Man_t *, int, int, Nf_Mat_t *)");
      }
      iVar1 = Nf_ObjMapRefDec(p,i_00,c_00);
      if (iVar1 == 0) {
        wVar3 = Nf_MatchDeref_rec(p,i_00,c_00,p->pNfObjs[(int)i_00].M[bVar7]);
        local_38 = local_38 + wVar3;
      }
      bVar5 = bVar5 + 4;
    }
    pwVar4 = &p->pCells[*(uint *)pM & 0xfffff].AreaW;
  }
  else {
    uVar6 = (uint)(c == 0);
    iVar1 = Nf_ObjMapRefNum(p,i,uVar6);
    if (iVar1 < 1) {
      __assert_fail("Nf_ObjMapRefNum(p, i, !c) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x6a4,"word Nf_MatchDeref_rec(Nf_Man_t *, int, int, Nf_Mat_t *)");
    }
    iVar1 = Nf_ObjMapRefDec(p,i,uVar6);
    if (iVar1 == 0) {
      local_38 = Nf_MatchDeref_rec(p,i,uVar6,p->pNfObjs[i].M[c == 0]);
    }
    else {
      local_38 = 0;
    }
    pwVar4 = &p->InvAreaW;
  }
  return local_38 + *pwVar4;
}

Assistant:

word Nf_MatchDeref_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM )
{
    word Area = 0;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    if ( pM->fCompl )
    {
        assert( Nf_ObjMapRefNum(p, i, !c) > 0 );
        if ( !Nf_ObjMapRefDec(p, i, !c) )
            Area += Nf_MatchDeref_rec( p, i, !c, Nf_ObjMatchD(p, i, !c) );
        return Area + p->InvAreaW;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) > 0 );
        if ( !Nf_ObjMapRefDec(p, iVar, fCompl) )
            Area += Nf_MatchDeref_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl) );
    }
    return Area + Nf_ManCell(p, pM->Gate)->AreaW;
}